

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenshtein_distance.hpp
# Opt level: O1

int levenshtein_distance(string *s1,string *s2)

{
  char cVar1;
  int iVar2;
  size_type sVar3;
  pointer pcVar4;
  int iVar5;
  int iVar6;
  undefined4 *puVar7;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  pointer pcVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int local_80;
  int local_74 [3];
  size_type local_68;
  ulong local_60;
  long local_58;
  undefined4 *local_50;
  pointer local_48;
  ulong local_40;
  ulong local_38;
  
  local_68 = s1->_M_string_length;
  sVar3 = s2->_M_string_length;
  lVar12 = local_68 << 0x20;
  uVar9 = 0xffffffffffffffff;
  if (-1 < lVar12 + 0x100000000) {
    uVar9 = lVar12 + 0x100000000 >> 0x1e;
  }
  puVar7 = (undefined4 *)operator_new__(uVar9);
  local_58 = lVar12 >> 0x1e;
  if (lVar12 != 0) {
    lVar8 = 1;
    lVar12 = local_58;
    do {
      puVar7[lVar8] = (int)lVar8;
      lVar8 = lVar8 + 1;
      lVar12 = lVar12 + -4;
    } while (lVar12 != 0);
  }
  local_80 = (int)sVar3;
  if (0 < local_80) {
    pcVar11 = (s1->_M_dataplus)._M_p;
    pcVar4 = (s2->_M_dataplus)._M_p;
    iVar2 = (int)local_68;
    uVar9 = 1;
    local_50 = puVar7;
    local_48 = pcVar11;
    do {
      *puVar7 = (int)uVar9;
      local_60 = uVar9;
      if (0 < (int)local_68) {
        uVar9 = uVar9 - 1;
        uVar13 = 1;
        uVar15 = uVar9 & 0xffffffff;
        local_40 = uVar9;
        do {
          uVar14 = puVar7[uVar13];
          cVar1 = pcVar4[uVar9];
          iVar5 = 0;
          if (pcVar11[uVar13 - 1] != cVar1) {
            local_38 = (ulong)uVar14;
            iVar5 = tolower((int)pcVar11[uVar13 - 1]);
            iVar6 = tolower((int)cVar1);
            uVar14 = (uint)local_38;
            iVar5 = (iVar5 != iVar6) + 1;
            uVar9 = local_40;
            pcVar11 = local_48;
            puVar7 = local_50;
          }
          local_74[0] = uVar14 + 4;
          local_74[1] = puVar7[uVar13 - 1] + 4;
          local_74[2] = iVar5 + (int)uVar15;
          lVar12 = 4;
          piVar10 = local_74;
          do {
            if (*(int *)((long)local_74 + lVar12) < *piVar10) {
              piVar10 = (int *)((long)local_74 + lVar12);
            }
            lVar12 = lVar12 + 4;
          } while (lVar12 != 0xc);
          puVar7[uVar13] = *piVar10;
          uVar13 = uVar13 + 1;
          uVar15 = (ulong)uVar14;
        } while (uVar13 != iVar2 + 1);
      }
      uVar9 = local_60 + 1;
    } while (uVar9 != local_80 + 1);
  }
  iVar2 = *(int *)((long)puVar7 + local_58);
  operator_delete__(puVar7);
  return iVar2;
}

Assistant:

int levenshtein_distance(const std::string &s1, const std::string &s2) {
  // To change the type this function manipulates and returns, change
  // the return type and the types of the two variables below.
  int s1len = s1.size();
  int s2len = s2.size();

  int column_start = 1;

  int *column = new int[s1len + 1];
  std::iota(column + column_start, column + s1len + 1, column_start);

  constexpr int insert_cost = 4;
  constexpr int change_cost = 2;
  constexpr int capitalize_cost = 1;

  for (int x = column_start; x <= s2len; x++) {
    column[0] = x;
    int last_diagonal = x - column_start;
    for (int y = column_start; y <= s1len; y++) {
      int old_diagonal = column[y];

      char c1 = s1[y - 1];
      char c2 = s2[x - 1];
      int diff_cost;
      if (c1 == c2) {
        diff_cost = 0;
      } else if (std::tolower(c1) == std::tolower(c2)) {
        diff_cost = capitalize_cost;
      } else {
        diff_cost = change_cost;
      }

      // clang-format off
      column[y] = std::min({
        column[y] + insert_cost,
        column[y - 1] + insert_cost,
        last_diagonal + diff_cost
      });
      // clang-format on
      last_diagonal = old_diagonal;
    }
  }
  int result = column[s1len];
  delete[] column;
  return result;
}